

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O1

void tt_face_free_name(TT_Face face)

{
  TT_LangTagRec *pTVar1;
  FT_Memory memory;
  ulong uVar2;
  TT_NameRec *pTVar3;
  TT_Name entry;
  TT_NameRec *pTVar4;
  TT_LangTagRec *pTVar5;
  
  pTVar4 = (face->name_table).names;
  memory = (((face->root).driver)->root).memory;
  if (pTVar4 != (TT_NameRec *)0x0) {
    uVar2 = (ulong)(face->name_table).numNameRecords;
    if (uVar2 != 0) {
      pTVar3 = pTVar4 + uVar2;
      do {
        ft_mem_free(memory,pTVar4->string);
        pTVar4->string = (FT_Byte *)0x0;
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 < pTVar3);
    }
    ft_mem_free(memory,(face->name_table).names);
    (face->name_table).names = (TT_NameRec *)0x0;
  }
  pTVar5 = (face->name_table).langTags;
  if (pTVar5 != (TT_LangTagRec *)0x0) {
    uVar2 = (ulong)(face->name_table).numLangTagRecords;
    if (uVar2 != 0) {
      pTVar1 = pTVar5 + uVar2;
      do {
        ft_mem_free(memory,pTVar5->string);
        pTVar5->string = (FT_Byte *)0x0;
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 < pTVar1);
    }
    ft_mem_free(memory,(face->name_table).langTags);
    (face->name_table).langTags = (TT_LangTagRec *)0x0;
  }
  (face->name_table).numNameRecords = 0;
  (face->name_table).storageOffset = 0;
  (face->name_table).numLangTagRecords = 0;
  (face->name_table).format = 0;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_name( TT_Face  face )
  {
    FT_Memory     memory = face->root.driver->root.memory;
    TT_NameTable  table  = &face->name_table;


    if ( table->names )
    {
      TT_Name  entry = table->names;
      TT_Name  limit = entry + table->numNameRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->names );
    }

    if ( table->langTags )
    {
      TT_LangTag  entry = table->langTags;
      TT_LangTag  limit = entry + table->numLangTagRecords;


      for ( ; entry < limit; entry++ )
        FT_FREE( entry->string );

      FT_FREE( table->langTags );
    }

    table->numNameRecords    = 0;
    table->numLangTagRecords = 0;
    table->format            = 0;
    table->storageOffset     = 0;
  }